

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cc
# Opt level: O1

fdb_status fdb_abort_transaction(fdb_file_handle *fhandle)

{
  fdb_status fVar1;
  
  if (fhandle != (fdb_file_handle *)0x0) {
    fVar1 = _fdb_abort_transaction(fhandle->root);
    return fVar1;
  }
  return FDB_RESULT_INVALID_HANDLE;
}

Assistant:

fdb_status _fdb_abort_transaction(fdb_kvs_handle *handle)
{
    if (!handle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    file_status_t fstatus;
    struct filemgr *file;

    if (handle->txn == NULL) {
        // there is no transaction started
        return FDB_RESULT_TRANSACTION_FAIL;
    }
    if (handle->kvs) {
        if (handle->kvs->type == KVS_SUB) {
            // deny transaction on sub handle
            return FDB_RESULT_INVALID_HANDLE;
        }
    }

    if (!atomic_cas_uint8_t(&handle->handle_busy, 0, 1)) {
        return FDB_RESULT_HANDLE_BUSY;
    }

    do { // repeat until file status is not REMOVED_PENDING
        fdb_check_file_reopen(handle, NULL);

        file = handle->file;
        filemgr_mutex_lock(file);
        fdb_sync_db_header(handle);

        fstatus = filemgr_get_file_status(file);
        if (fstatus == FILE_REMOVED_PENDING) {
            // we must not abort transaction on this file
            // file status was changed by other thread .. start over
            filemgr_mutex_unlock(file);
        }
    } while (fstatus == FILE_REMOVED_PENDING);

    wal_discard(file, handle->txn);
    wal_remove_transaction(file, handle->txn);

    free(handle->txn->items);
    free(handle->txn->wrapper);
    free(handle->txn);
    handle->txn = NULL;

    filemgr_mutex_unlock(file);

    atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
    return FDB_RESULT_SUCCESS;
}